

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall cmGhsMultiTargetGenerator::Generate(cmGhsMultiTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  string *psVar4;
  cmGlobalGhsMultiGenerator *pcVar5;
  undefined4 extraout_var;
  undefined1 local_360 [8];
  string msg_1;
  undefined1 local_230 [8];
  string msg;
  Names local_110;
  cmGhsMultiTargetGenerator *local_10;
  cmGhsMultiTargetGenerator *this_local;
  
  local_10 = this;
  TVar2 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  switch(TVar2) {
  case EXECUTABLE:
    cmGeneratorTarget::GetExecutableNames(&local_110,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)&local_110.Real);
    cmGeneratorTarget::Names::~Names(&local_110);
    bVar1 = DetermineIfIntegrityApp(this);
    if (bVar1) {
      this->TagType = INTERGRITY_APPLICATION;
    }
    else {
      this->TagType = PROGRAM;
    }
    break;
  case STATIC_LIBRARY:
    cmGeneratorTarget::GetLibraryNames
              ((Names *)((long)&msg.field_2 + 8),this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=
              ((string *)&this->TargetNameReal,(string *)&stack0xfffffffffffffe30);
    cmGeneratorTarget::Names::~Names((Names *)((long)&msg.field_2 + 8));
    this->TagType = LIBRARY;
    break;
  case SHARED_LIBRARY:
    cmStrCat<char_const(&)[47],std::__cxx11::string_const&>
              ((string *)local_230,(char (*) [47])"add_library(<name> SHARED ...) not supported: ",
               &this->Name);
    cmSystemTools::Message((string *)local_230,(char *)0x0);
    std::__cxx11::string::~string((string *)local_230);
    return;
  case MODULE_LIBRARY:
    cmStrCat<char_const(&)[47],std::__cxx11::string_const&>
              ((string *)local_360,(char (*) [47])"add_library(<name> MODULE ...) not supported: ",
               &this->Name);
    cmSystemTools::Message((string *)local_360,(char *)0x0);
    std::__cxx11::string::~string((string *)local_360);
    return;
  case OBJECT_LIBRARY:
    cmGeneratorTarget::GetLibraryNames
              ((Names *)((long)&msg_1.field_2 + 8),this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=
              ((string *)&this->TargetNameReal,(string *)&stack0xfffffffffffffd00);
    cmGeneratorTarget::Names::~Names((Names *)((long)&msg_1.field_2 + 8));
    this->TagType = SUBPROJECT;
    break;
  case UTILITY:
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)psVar4);
    this->TagType = CUSTOM_TARGET;
    break;
  case GLOBAL_TARGET:
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)psVar4);
    pcVar5 = GetGlobalGenerator(this);
    iVar3 = (*(pcVar5->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1c])();
    bVar1 = std::operator==(&this->TargetNameReal,(char *)CONCAT44(extraout_var,iVar3));
    if (!bVar1) {
      return;
    }
    this->TagType = CUSTOM_TARGET;
    break;
  default:
    goto switchD_0086fcfa_default;
  }
  GenerateTarget(this);
switchD_0086fcfa_default:
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::Generate()
{
  // Determine type of target for this project
  switch (this->GeneratorTarget->GetType()) {
    case cmStateEnums::EXECUTABLE: {
      // Get the name of the executable to generate.
      this->TargetNameReal =
        this->GeneratorTarget->GetExecutableNames(this->ConfigName).Real;
      if (this->cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()) {
        this->TagType = GhsMultiGpj::INTERGRITY_APPLICATION;
      } else {
        this->TagType = GhsMultiGpj::PROGRAM;
      }
      break;
    }
    case cmStateEnums::STATIC_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::LIBRARY;
      break;
    }
    case cmStateEnums::SHARED_LIBRARY: {
      std::string msg =
        cmStrCat("add_library(<name> SHARED ...) not supported: ", this->Name);
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::SUBPROJECT;
      break;
    }
    case cmStateEnums::MODULE_LIBRARY: {
      std::string msg =
        cmStrCat("add_library(<name> MODULE ...) not supported: ", this->Name);
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::UTILITY: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      break;
    }
    case cmStateEnums::GLOBAL_TARGET: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      if (this->TargetNameReal ==
          this->GetGlobalGenerator()->GetInstallTargetName()) {
        this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      } else {
        return;
      }
      break;
    }
    default:
      return;
  }

  this->GenerateTarget();
}